

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O1

void testCustomAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  _Alloc_hider __filename;
  char *b;
  char *pcVar5;
  ChannelList *this;
  Header *pHVar6;
  TypedAttribute<int> *pTVar7;
  OpaqueAttribute *pOVar8;
  TypedAttribute<Imf_2_5::Glorp> *pTVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  undefined1 xtc;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar20 [16];
  OutputFile out;
  string filename;
  FrameBuffer fb;
  Header hdr;
  long lVar21;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing custom attributes",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  b = (char *)operator_new__(0x29bf4);
  auVar4 = _DAT_00207af0;
  auVar3 = _DAT_00207ae0;
  pcVar5 = b + 4;
  iVar10 = 1;
  iVar11 = 0;
  iVar18 = (int)DAT_00207b00;
  iVar19 = DAT_00207b00._4_4_;
  uVar12 = 0;
  do {
    iVar13 = (int)((uVar12 & 0xffffffff) / 0x11);
    iVar14 = iVar10 + iVar13 * -0xaa;
    uVar15 = (ulong)(uint)(iVar11 + iVar13 * -0xaa);
    uVar16 = 0;
    lVar17 = 0;
    auVar20 = auVar3;
    do {
      if (SUB164(auVar20 ^ auVar4,4) == iVar19 && SUB164(auVar20 ^ auVar4,0) < iVar18) {
        *(float *)(pcVar5 + lVar17 + -4) = (float)(int)((int)uVar15 + (uVar16 / 10) * -10);
        *(float *)(pcVar5 + lVar17) = (float)(int)(iVar14 + (uVar16 / 10) * -10);
      }
      lVar21 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar21 + 2;
      lVar17 = lVar17 + 8;
      iVar14 = iVar14 + 2;
      uVar16 = uVar16 + 2;
      uVar15 = (ulong)((int)uVar15 + 2);
    } while (lVar17 != 0x368);
    uVar12 = uVar12 + 1;
    pcVar5 = pcVar5 + 0x364;
    iVar10 = iVar10 + 10;
    iVar11 = iVar11 + 10;
  } while (uVar12 != 0xc5);
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
  xtc = (undefined1)uVar15;
  std::__cxx11::string::append((char *)&filename);
  __filename = filename._M_dataplus;
  Imf_2_5::Attribute::registerAttributeType
            ("glorp",Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::makeNewAttribute);
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&hdr,0xd9,0xc5,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_2_5::Attribute::Attribute((Attribute *)&out);
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)&PTR__Attribute_0043a9b0;
  out._data = (Data *)CONCAT44(out._data._4_4_,0x19);
  Imf_2_5::Header::insert(&hdr,"custom1",(Attribute *)&out);
  Imf_2_5::Attribute::~Attribute((Attribute *)&out);
  Imf_2_5::Attribute::Attribute((Attribute *)&out);
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)&PTR__Attribute_0043b0a0;
  out._data = (Data *)0x900000004;
  Imf_2_5::Header::insert(&hdr,"custom2",(Attribute *)&out);
  Imf_2_5::Attribute::~Attribute((Attribute *)&out);
  this = Imf_2_5::Header::channels(&hdr);
  Imf_2_5::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_2_5::ChannelList::insert(this,"F",(Channel *)&out);
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_2_5::Slice::Slice((Slice *)&out,FLOAT,b,4,0x364,1,1,0.0,(bool)xtc,false);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
  std::ostream::flush();
  remove(__filename._M_p);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar10);
  Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
  pcVar5 = (char *)0xc5;
  Imf_2_5::OutputFile::writePixels(&out,0xc5);
  Imf_2_5::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  Imf_2_5::Header::~Header(&hdr);
  Imf_2_5::Attribute::unRegisterAttributeType((Attribute *)"glorp",pcVar5);
  out.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&hdr,0x40,0x40,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile((InputFile *)&out,__filename._M_p,iVar10);
  pHVar6 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar7 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>(pHVar6,"custom1");
  pHVar6 = Imf_2_5::InputFile::header((InputFile *)&out);
  pOVar8 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::OpaqueAttribute>(pHVar6,"custom2");
  if ((pTVar7 == (TypedAttribute<int> *)0x0) || (pTVar7->_value != 0x19)) {
    __assert_fail("c1 != 0 && c1->value() == 25",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xbf,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  if (pOVar8 == (OpaqueAttribute *)0x0) {
    __assert_fail("c2 != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xc0,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pHVar6 = Imf_2_5::InputFile::header((InputFile *)&out);
  Imf_2_5::Header::operator=(&hdr,pHVar6);
  Imf_2_5::InputFile::~InputFile((InputFile *)&out);
  Imf_2_5::Attribute::registerAttributeType
            ("glorp",Imf_2_5::TypedAttribute<Imf_2_5::Glorp>::makeNewAttribute);
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_2_5::Slice::Slice((Slice *)&out,FLOAT,b,4,0x364,1,1,0.0,(bool)xtc,false);
  Imf_2_5::FrameBuffer::insert(&fb,"F",(Slice *)&out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
  std::ostream::flush();
  remove(__filename._M_p);
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::OutputFile::OutputFile(&out,__filename._M_p,&hdr,iVar10);
  Imf_2_5::OutputFile::setFrameBuffer(&out,&fb);
  Imf_2_5::OutputFile::writePixels(&out,0xc5);
  Imf_2_5::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&fb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," reading",8);
  std::ostream::flush();
  iVar10 = Imf_2_5::globalThreadCount();
  Imf_2_5::InputFile::InputFile((InputFile *)&out,__filename._M_p,iVar10);
  pHVar6 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar7 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<int>>(pHVar6,"custom1");
  pHVar6 = Imf_2_5::InputFile::header((InputFile *)&out);
  pTVar9 = Imf_2_5::Header::findTypedAttribute<Imf_2_5::TypedAttribute<Imf_2_5::Glorp>>
                     (pHVar6,"custom2");
  if ((pTVar7 != (TypedAttribute<int> *)0x0) && (pTVar7->_value == 0x19)) {
    if ((pTVar9 != (TypedAttribute<Imf_2_5::Glorp> *)0x0) &&
       (((pTVar9->_value).a == 4 && ((pTVar9->_value).b == 9)))) {
      Imf_2_5::InputFile::~InputFile((InputFile *)&out);
      remove(__filename._M_p);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      Imf_2_5::Header::~Header(&hdr);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      operator_delete__(b);
      return;
    }
    __assert_fail("c2 != 0 && c2->value().a == 4 && c2->value().b == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                  ,0xf7,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  __assert_fail("c1 != 0 && c1->value() == 25",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testCustomAttributes.cpp"
                ,0xf6,
                "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testCustomAttributes (const std::string &tempDir)
{
    try
    {
	cout << "Testing custom attributes" << endl;

	const int W = 217;
	const int H = 197;

	Array2D<float> pf (H, W);
	fillPixels (pf, W, H);

	std::string filename = tempDir + "imf_test_custom_attr.exr";

	writeReadCustomAttr (pf, filename.c_str(), W, H);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}